

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDEdge::HasInteriorEdgeTopology(ON_SubDEdge *this,bool bRequireOppositeFaceDirections)

{
  uint uVar1;
  uint uVar2;
  char *sFormat;
  ulong uVar3;
  int line_number;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  uint uVar7;
  
  if (this->m_face_count == 2) {
    uVar5 = this->m_face2[0].m_ptr;
    uVar3 = this->m_face2[1].m_ptr;
    uVar1 = (uint)uVar3;
    uVar2 = (uint)uVar5;
    if ((!bRequireOppositeFaceDirections) || (((uVar1 ^ uVar2) & 1) != 0)) {
      uVar5 = uVar5 & 0xfffffffffffffff8;
      if (uVar5 == 0) {
        return false;
      }
      uVar3 = uVar3 & 0xfffffffffffffff8;
      if (uVar3 == 0) {
        return false;
      }
      if (uVar5 == uVar3) {
        return false;
      }
      if (*(ushort *)(uVar5 + 0x9c) != 0) {
        puVar6 = (ulong *)(uVar5 + 0xa0);
        uVar7 = 0;
        do {
          if ((uVar7 == 4) &&
             (puVar6 = *(ulong **)(uVar5 + 0xc0), *(ulong **)(uVar5 + 0xc0) == (ulong *)0x0)) break;
          uVar4 = *puVar6;
          if ((ON_SubDEdge *)(uVar4 & 0xfffffffffffffff8) == this) goto LAB_005c3a54;
          uVar7 = uVar7 + 1;
          puVar6 = puVar6 + 1;
        } while (*(ushort *)(uVar5 + 0x9c) != uVar7);
      }
      uVar4 = 0;
LAB_005c3a54:
      if (*(ushort *)(uVar3 + 0x9c) != 0) {
        puVar6 = (ulong *)(uVar3 + 0xa0);
        uVar7 = 0;
        do {
          if ((uVar7 == 4) &&
             (puVar6 = *(ulong **)(uVar3 + 0xc0), *(ulong **)(uVar3 + 0xc0) == (ulong *)0x0)) break;
          uVar5 = *puVar6;
          if ((ON_SubDEdge *)(uVar5 & 0xfffffffffffffff8) == this) goto LAB_005c3aa6;
          uVar7 = uVar7 + 1;
          puVar6 = puVar6 + 1;
        } while (*(ushort *)(uVar3 + 0x9c) != uVar7);
      }
      uVar5 = 0;
LAB_005c3aa6:
      if ((ON_SubDEdge *)(uVar4 & 0xfffffffffffffff8) == this) {
        if ((((uint)uVar4 ^ uVar2) & 1) == 0) {
          if ((ON_SubDEdge *)(uVar5 & 0xfffffffffffffff8) == this) {
            if ((((uint)uVar5 ^ uVar1) & 1) == 0) {
              if ((this->m_vertex[0] != (ON_SubDVertex *)0x0) &&
                 (this->m_vertex[1] != (ON_SubDVertex *)0x0 &&
                  this->m_vertex[0] != this->m_vertex[1])) {
                return true;
              }
              ON_SubDIncrementErrorCount();
              sFormat = "m_vertex[] has null or invalid pointers.";
              line_number = 0x19d7;
            }
            else {
              ON_SubDIncrementErrorCount();
              sFormat = "m_face2[1] has inconsistent direction flags.";
              line_number = 0x19d2;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            sFormat = "m_face2[1] does not reference this edge.";
            line_number = 0x19cd;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          sFormat = "m_face2[0] has inconsistent direction flags.";
          line_number = 0x19c8;
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        sFormat = "m_face2[0] does not reference this edge.";
        line_number = 0x19c3;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,line_number,"",sFormat);
      return false;
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdge::HasInteriorEdgeTopology(bool bRequireOppositeFaceDirections) const
{
  for (;;)
  {
    if (2 != m_face_count)
      break;
    if (bRequireOppositeFaceDirections && ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr) == ON_SUBD_FACE_DIRECTION(m_face2[1].m_ptr))
      break;
    const ON_SubDFace* f[2] = { ON_SUBD_FACE_POINTER(m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(m_face2[1].m_ptr) };
    if ( nullptr == f[0] || nullptr == f[1] || f[0] == f[1])
      break;
    const ON_SubDEdgePtr feptr[2] = { f[0]->EdgePtrFromEdge(this), f[1]->EdgePtrFromEdge(this) };
    if (this != ON_SUBD_EDGE_POINTER(feptr[0].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(feptr[0].m_ptr) != ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] has inconsistent direction flags.");
      break;
    }
    if (this != ON_SUBD_EDGE_POINTER(feptr[1].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[1] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(feptr[1].m_ptr) != ON_SUBD_FACE_DIRECTION(m_face2[1].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[1] has inconsistent direction flags.");
      break;
    }
    if (nullptr == m_vertex[0] || nullptr == m_vertex[1] || m_vertex[0] == m_vertex[1])
    {
      ON_SUBD_ERROR("m_vertex[] has null or invalid pointers.");
      break;
    }
    return true;
  }
  return false;
}